

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

Test * DyndepParserTestExplicitIn::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x218);
  DyndepParserTestExplicitIn((DyndepParserTestExplicitIn *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DyndepParserTest, ExplicitIn) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep exp\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: explicit inputs not supported\n"
            "build out: dyndep exp\n"
            "                     ^ near here", err);
}